

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O2

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  char *pcVar1;
  
  glfwGetTime();
  pcVar1 = "released";
  if (action == 1) {
    pcVar1 = "pressed";
  }
  printf("%0.2f Key %s\n",pcVar1);
  if (action == 1) {
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
    if (key == 0x20) {
      glfwIconifyWindow(window);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    printf("%0.2f Key %s\n",
           glfwGetTime(),
           action == GLFW_PRESS ? "pressed" : "released");

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_SPACE:
            glfwIconifyWindow(window);
            break;
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;
    }
}